

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_sockets.c
# Opt level: O1

int mbedtls_net_poll(mbedtls_net_context *ctx,uint32_t rw,uint32_t timeout)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  fd_set *__arr;
  timeval *__timeout;
  fd_set write_fds;
  fd_set read_fds;
  timeval tv;
  fd_set local_138;
  fd_set local_b8;
  timeval local_38;
  
  uVar1 = ctx->fd;
  if ((int)uVar1 < 0) {
    uVar4 = 0xffffffbb;
  }
  else {
    local_b8.fds_bits[0xe] = 0;
    local_b8.fds_bits[0xf] = 0;
    local_b8.fds_bits[0xc] = 0;
    local_b8.fds_bits[0xd] = 0;
    local_b8.fds_bits[10] = 0;
    local_b8.fds_bits[0xb] = 0;
    local_b8.fds_bits[8] = 0;
    local_b8.fds_bits[9] = 0;
    local_b8.fds_bits[6] = 0;
    local_b8.fds_bits[7] = 0;
    local_b8.fds_bits[4] = 0;
    local_b8.fds_bits[5] = 0;
    local_b8.fds_bits[2] = 0;
    local_b8.fds_bits[3] = 0;
    local_b8.fds_bits[0] = 0;
    local_b8.fds_bits[1] = 0;
    if ((rw & 1) != 0) {
      rw = rw & 0xfffffffe;
      local_b8.fds_bits[uVar1 >> 6] = local_b8.fds_bits[uVar1 >> 6] | 1L << ((byte)uVar1 & 0x3f);
    }
    local_138.fds_bits[0xe] = 0;
    local_138.fds_bits[0xf] = 0;
    local_138.fds_bits[0xc] = 0;
    local_138.fds_bits[0xd] = 0;
    local_138.fds_bits[10] = 0;
    local_138.fds_bits[0xb] = 0;
    local_138.fds_bits[8] = 0;
    local_138.fds_bits[9] = 0;
    local_138.fds_bits[6] = 0;
    local_138.fds_bits[7] = 0;
    local_138.fds_bits[4] = 0;
    local_138.fds_bits[5] = 0;
    local_138.fds_bits[2] = 0;
    local_138.fds_bits[3] = 0;
    local_138.fds_bits[0] = 0;
    local_138.fds_bits[1] = 0;
    if ((rw & 2) != 0) {
      rw = rw & 0xfffffffd;
      local_138.fds_bits[uVar1 >> 6] = local_138.fds_bits[uVar1 >> 6] | 1L << ((byte)uVar1 & 0x3f);
    }
    uVar4 = 0xffffffb7;
    if (rw == 0) {
      local_38.tv_sec = (ulong)timeout / 1000;
      local_38.tv_usec = (__suseconds_t)((timeout % 1000) * 1000);
      __timeout = (timeval *)0x0;
      if (timeout != 0xffffffff) {
        __timeout = &local_38;
      }
      do {
        iVar3 = select(uVar1 + 1,&local_b8,&local_138,(fd_set *)0x0,__timeout);
      } while (iVar3 == 4);
      if (iVar3 < 0) {
        uVar4 = 0xffffffb9;
      }
      else {
        uVar2 = (uint)(((ulong)local_b8.fds_bits[uVar1 >> 6] >> (uVar1 & 0x3f) & 1) != 0);
        uVar4 = uVar2 + 2;
        if (((ulong)local_138.fds_bits[uVar1 >> 6] >> (uVar1 & 0x3f) & 1) == 0) {
          uVar4 = uVar2;
        }
      }
    }
  }
  return uVar4;
}

Assistant:

int mbedtls_net_poll( mbedtls_net_context *ctx, uint32_t rw, uint32_t timeout )
{
    int ret;
    struct timeval tv;

    fd_set read_fds;
    fd_set write_fds;

    int fd = ctx->fd;

    if( fd < 0 )
        return( MBEDTLS_ERR_NET_INVALID_CONTEXT );

#if defined(__has_feature)
#if __has_feature(memory_sanitizer)
    /* Ensure that memory sanitizers consider read_fds and write_fds as
     * initialized even on platforms such as Glibc/x86_64 where FD_ZERO
     * is implemented in assembly. */
    memset( &read_fds, 0, sizeof( read_fds ) );
    memset( &write_fds, 0, sizeof( write_fds ) );
#endif
#endif

    FD_ZERO( &read_fds );
    if( rw & MBEDTLS_NET_POLL_READ )
    {
        rw &= ~MBEDTLS_NET_POLL_READ;
        FD_SET( fd, &read_fds );
    }

    FD_ZERO( &write_fds );
    if( rw & MBEDTLS_NET_POLL_WRITE )
    {
        rw &= ~MBEDTLS_NET_POLL_WRITE;
        FD_SET( fd, &write_fds );
    }

    if( rw != 0 )
        return( MBEDTLS_ERR_NET_BAD_INPUT_DATA );

    tv.tv_sec  = timeout / 1000;
    tv.tv_usec = ( timeout % 1000 ) * 1000;

    do
    {
        ret = select( fd + 1, &read_fds, &write_fds, NULL,
                      timeout == (uint32_t) -1 ? NULL : &tv );
    }
    while( IS_EINTR( ret ) );

    if( ret < 0 )
        return( MBEDTLS_ERR_NET_POLL_FAILED );

    ret = 0;
    if( FD_ISSET( fd, &read_fds ) )
        ret |= MBEDTLS_NET_POLL_READ;
    if( FD_ISSET( fd, &write_fds ) )
        ret |= MBEDTLS_NET_POLL_WRITE;

    return( ret );
}